

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiTexture *pTexture)

{
  char *msg;
  
  if (pTexture->pcData == (aiTexel *)0x0) {
    msg = "aiTexture::pcData is NULL";
  }
  else {
    if (pTexture->mHeight == 0) {
      if (pTexture->mWidth == 0) {
        msg = "aiTexture::mWidth is zero (compressed texture)";
        goto LAB_00350436;
      }
      if (pTexture->achFormatHint[3] == '\0') {
        if (pTexture->achFormatHint[0] == '.') {
          ReportWarning(this,
                        "aiTexture::achFormatHint should contain a file extension without a leading dot (format hint: %s)."
                       );
        }
      }
      else {
        ReportWarning(this,"aiTexture::achFormatHint must be zero-terminated");
      }
    }
    else if (pTexture->mWidth == 0) {
      ReportError(this,"aiTexture::mWidth is zero (aiTexture::mHeight is %i, uncompressed texture)")
      ;
    }
    if ((((0x19 < (byte)(pTexture->achFormatHint[0] + 0xbfU)) &&
         (0x19 < (byte)(pTexture->achFormatHint[1] + 0xbfU))) &&
        (0x19 < (byte)(pTexture->achFormatHint[2] + 0xbfU))) &&
       (0x19 < (byte)(pTexture->achFormatHint[3] + 0xbfU))) {
      return;
    }
    msg = "aiTexture::achFormatHint contains non-lowercase letters";
  }
LAB_00350436:
  ReportError(this,msg);
}

Assistant:

void ValidateDSProcess::Validate( const aiTexture* pTexture)
{
    // the data section may NEVER be NULL
    if (!pTexture->pcData)  {
        ReportError("aiTexture::pcData is NULL");
    }
    if (pTexture->mHeight)
    {
        if (!pTexture->mWidth){
        	ReportError("aiTexture::mWidth is zero (aiTexture::mHeight is %i, uncompressed texture)",
        			pTexture->mHeight);
        }
    }
    else
    {
        if (!pTexture->mWidth) {
            ReportError("aiTexture::mWidth is zero (compressed texture)");
        }
        if ('\0' != pTexture->achFormatHint[3]) {
            ReportWarning("aiTexture::achFormatHint must be zero-terminated");
        }
        else if ('.'  == pTexture->achFormatHint[0])    {
            ReportWarning("aiTexture::achFormatHint should contain a file extension "
                "without a leading dot (format hint: %s).",pTexture->achFormatHint);
        }
    }

    const char* sz = pTexture->achFormatHint;
    if ((sz[0] >= 'A' && sz[0] <= 'Z') ||
        (sz[1] >= 'A' && sz[1] <= 'Z') ||
        (sz[2] >= 'A' && sz[2] <= 'Z') ||
        (sz[3] >= 'A' && sz[3] <= 'Z')) {
        ReportError("aiTexture::achFormatHint contains non-lowercase letters");
    }
}